

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deDirectoryIterator.cpp
# Opt level: O0

FilePath * __thiscall
de::DirectoryIterator::getItem(FilePath *__return_storage_ptr__,DirectoryIterator *this)

{
  FilePath local_38;
  DirectoryIterator *local_18;
  DirectoryIterator *this_local;
  
  local_18 = this;
  this_local = (DirectoryIterator *)__return_storage_ptr__;
  FilePath::FilePath(&local_38,this->m_curEntry->d_name);
  FilePath::join(__return_storage_ptr__,&this->m_path,&local_38);
  FilePath::~FilePath(&local_38);
  return __return_storage_ptr__;
}

Assistant:

FilePath DirectoryIterator::getItem (void) const
{
	DE_ASSERT(hasItem());
	return FilePath::join(m_path, m_curEntry->d_name);
}